

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O0

GLFWmonitor * vera::getMonitorFromWindow(GLFWwindow *window)

{
  undefined8 uVar1;
  GLFWmonitor **ppGVar2;
  GLFWvidmode *pGVar3;
  _rect _Var4;
  int local_90;
  int iStack_8c;
  _rect local_88;
  _rect overlapRect;
  _rect scratchRect;
  _rect monitorRect;
  _rect windowRect;
  int i;
  int overlapMonitor;
  uint overlapDim;
  uint currentDim;
  GLFWvidmode *vidmode;
  GLFWmonitor **monitors;
  GLFWmonitor *pGStack_18;
  int monitorCount;
  GLFWmonitor *result;
  GLFWwindow *window_local;
  
  pGStack_18 = (GLFWmonitor *)0x0;
  result = (GLFWmonitor *)window;
  memset(&overlapRect.w,0,0x10);
  memset(&local_88.w,0,0x10);
  if (result == (GLFWmonitor *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/src/window.cpp"
                  ,0x81,"GLFWmonitor *vera::getMonitorFromWindow(GLFWwindow *)");
  }
  ppGVar2 = glfwGetMonitors((int *)((long)&monitors + 4));
  if (monitors._4_4_ == 1) {
    pGStack_18 = *ppGVar2;
  }
  else if (1 < monitors._4_4_) {
    glfwGetWindowPos((GLFWwindow *)result,&monitorRect.w,&monitorRect.h);
    glfwGetWindowSize((GLFWwindow *)result,&windowRect.x,&windowRect.y);
    glfwGetWindowFrameSize
              ((GLFWwindow *)result,&overlapRect.w,&overlapRect.h,&scratchRect.x,&scratchRect.y);
    monitorRect.w = monitorRect.w - overlapRect.w;
    monitorRect.h = monitorRect.h - overlapRect.h;
    windowRect.x = overlapRect.w + scratchRect.x + windowRect.x;
    windowRect.y = overlapRect.h + scratchRect.y + windowRect.y;
    windowRect.h = -1;
    for (windowRect.w = 0; windowRect.w < monitors._4_4_; windowRect.w = windowRect.w + 1) {
      glfwGetMonitorPos(ppGVar2[windowRect.w],&scratchRect.w,&scratchRect.h);
      pGVar3 = glfwGetVideoMode(ppGVar2[windowRect.w]);
      monitorRect.x = pGVar3->width;
      monitorRect.y = pGVar3->height;
      _Var4 = _get_intersection((_rect *)&monitorRect.w,(_rect *)&scratchRect.w);
      _local_90 = _Var4._0_8_;
      overlapRect.w = local_90;
      overlapRect.h = iStack_8c;
      local_88._0_8_ = _Var4._8_8_;
      uVar1._0_4_ = local_88.x;
      uVar1._4_4_ = local_88.y;
      scratchRect.x = _Var4.w;
      scratchRect.y = _Var4.h;
      if ((scratchRect.x * scratchRect.y != 0) &&
         ((uint)(overlapRect.x * overlapRect.y) < (uint)(scratchRect.x * scratchRect.y))) {
        local_88.w = local_90;
        local_88.h = iStack_8c;
        overlapRect.x = local_88.x;
        overlapRect.y = local_88.y;
        windowRect.h = windowRect.w;
      }
      scratchRect._0_8_ = uVar1;
    }
    if (-1 < windowRect.h) {
      pGStack_18 = ppGVar2[windowRect.h];
    }
  }
  return pGStack_18;
}

Assistant:

GLFWAPI GLFWmonitor* getMonitorFromWindow(GLFWwindow* window) {  
    GLFWmonitor* result = NULL;

    int monitorCount;
    GLFWmonitor** monitors;
    const GLFWvidmode* vidmode;

    unsigned int currentDim, overlapDim;
    int overlapMonitor, i;

    _rect windowRect;
    _rect monitorRect;
    _rect scratchRect = { 0, 0, 0, 0 };
    _rect overlapRect = { 0, 0, 0, 0 };

    assert(window != NULL);

    // _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    monitors = glfwGetMonitors(&monitorCount);

    if (monitorCount == 1)
        result = monitors[0];

    else if (monitorCount > 1) {
        glfwGetWindowPos(window, &windowRect.x, &windowRect.y);
        glfwGetWindowSize(window, &windowRect.w, &windowRect.h);

        glfwGetWindowFrameSize(window, &scratchRect.x, &scratchRect.y, 
        &scratchRect.w, &scratchRect.h);

        windowRect.x -= scratchRect.x;
        windowRect.y -= scratchRect.y;
        windowRect.w += scratchRect.x + scratchRect.w;
        windowRect.h += scratchRect.y + scratchRect.h;

        overlapMonitor = -1;

        for (i = 0; i < monitorCount; i++) {
            glfwGetMonitorPos(monitors[i], &monitorRect.x, &monitorRect.y);

            vidmode = glfwGetVideoMode(monitors[i]);
            monitorRect.w = vidmode->width;
            monitorRect.h = vidmode->height;

            scratchRect = _get_intersection(&windowRect, &monitorRect);

            currentDim = scratchRect.w * scratchRect.h;
            overlapDim = overlapRect.w * overlapRect.h;

            if (currentDim > 0 && currentDim > overlapDim) {
                overlapRect = scratchRect;
                overlapMonitor = i;
            }
        }

        if (overlapMonitor >= 0)
        result = monitors[overlapMonitor];
    }

    return result;
}